

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

void on_frame_received(void *context,AMQP_VALUE performative,uint32_t payload_size,
                      uchar *payload_bytes)

{
  BEGIN_HANDLE name;
  _Bool _Var1;
  char cVar2;
  int iVar3;
  AMQP_VALUE descriptor;
  LINK_ENDPOINT_INSTANCE *pLVar4;
  LINK_ENDPOINT_HANDLE pLVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  SESSION_STATE session_state;
  char *pcVar10;
  CONNECTION_HANDLE pCVar11;
  ulong uVar12;
  BEGIN_HANDLE begin_handle;
  role role;
  ATTACH_HANDLE attach_handle;
  AMQP_VALUE source;
  AMQP_VALUE target;
  fields properties;
  BEGIN_HANDLE local_60;
  role local_51;
  undefined8 local_50;
  AMQP_VALUE local_48;
  AMQP_VALUE local_40;
  fields local_38;
  
  descriptor = amqpvalue_get_inplace_descriptor(performative);
  _Var1 = is_begin_type_by_descriptor(descriptor);
  if (_Var1) {
    iVar3 = amqpvalue_get_begin(performative,&local_60);
    if (iVar3 != 0) {
      pCVar11 = *(CONNECTION_HANDLE *)((long)context + 0x18);
      pcVar9 = "Cannot decode BEGIN frame";
LAB_0011accc:
      connection_close(pCVar11,"amqp:decode-error",pcVar9,(AMQP_VALUE)0x0);
      return;
    }
    iVar3 = begin_get_incoming_window(local_60,(uint32_t *)((long)context + 0x60));
    if ((iVar3 != 0) ||
       (iVar3 = begin_get_next_outgoing_id(local_60,(transfer_number *)((long)context + 0x4c)),
       iVar3 != 0)) {
      begin_destroy(local_60);
      session_set_state((SESSION_INSTANCE *)context,SESSION_STATE_DISCARDING);
      pCVar11 = *(CONNECTION_HANDLE *)((long)context + 0x18);
      pcVar9 = "Cannot get incoming windows and next outgoing id";
      goto LAB_0011accc;
    }
    begin_destroy(local_60);
    if (*(int *)((long)context + 0x10) == 1) {
      session_set_state((SESSION_INSTANCE *)context,SESSION_STATE_BEGIN_RCVD);
      iVar3 = send_begin((SESSION_INSTANCE *)context);
      if (iVar3 != 0) {
        pCVar11 = *(CONNECTION_HANDLE *)((long)context + 0x18);
        pcVar9 = "Failed sending BEGIN frame";
LAB_0011b076:
        connection_close(pCVar11,"amqp:internal-error",pcVar9,(AMQP_VALUE)0x0);
        goto LAB_0011b07d;
      }
    }
    else if (*(int *)((long)context + 0x10) != 2) {
      return;
    }
    session_state = SESSION_STATE_MAPPED;
LAB_0011b08f:
    session_set_state((SESSION_INSTANCE *)context,session_state);
    return;
  }
  _Var1 = is_attach_type_by_descriptor(descriptor);
  if (!_Var1) {
    _Var1 = is_detach_type_by_descriptor(descriptor);
    if (_Var1) {
      iVar3 = amqpvalue_get_detach(performative,(DETACH_HANDLE *)&local_60);
      if (iVar3 == 0) {
        iVar3 = detach_get_handle((DETACH_HANDLE)local_60,(handle *)&local_50);
        if (iVar3 != 0) {
          end_session_with_error
                    ((SESSION_INSTANCE *)context,"amqp:decode-error",
                     "Cannot get handle from DETACH frame");
          detach_destroy((DETACH_HANDLE)local_60);
          return;
        }
        detach_destroy((DETACH_HANDLE)local_60);
        uVar12 = (ulong)*(uint *)((long)context + 0x30);
        if (uVar12 == 0) {
          uVar6 = 0;
        }
        else {
          uVar8 = 0;
          do {
            uVar6 = uVar8;
            if (*(handle *)(*(long *)(*(long *)((long)context + 0x28) + uVar8 * 8) + 8) ==
                (handle)local_50) break;
            uVar8 = uVar8 + 1;
            uVar6 = uVar12;
          } while (uVar12 != uVar8);
        }
        if ((uint)uVar6 == *(uint *)((long)context + 0x30)) {
          pLVar5 = (LINK_ENDPOINT_HANDLE)0x0;
        }
        else {
          pLVar5 = *(LINK_ENDPOINT_HANDLE *)
                    (*(long *)((long)context + 0x28) + (uVar6 & 0xffffffff) * 8);
        }
        if (pLVar5 != (LINK_ENDPOINT_HANDLE)0x0) {
          if (pLVar5->link_endpoint_state == LINK_ENDPOINT_STATE_DETACHING) {
            remove_link_endpoint(pLVar5);
            free_link_endpoint(pLVar5);
            return;
          }
          pLVar5->link_endpoint_state = LINK_ENDPOINT_STATE_DETACHING;
          (*pLVar5->frame_received_callback)
                    (pLVar5->callback_context,performative,payload_size,payload_bytes);
          return;
        }
        pcVar10 = "amqp:session:unattached-handle";
        pcVar9 = "";
      }
      else {
        pcVar10 = "amqp:decode-error";
        pcVar9 = "Cannot decode DETACH frame";
      }
LAB_0011b0d8:
      end_session_with_error((SESSION_INSTANCE *)context,pcVar10,pcVar9);
      return;
    }
    _Var1 = is_flow_type_by_descriptor(descriptor);
    if (_Var1) {
      iVar3 = amqpvalue_get_flow(performative,(FLOW_HANDLE *)&local_60);
      if (iVar3 == 0) {
        iVar3 = flow_get_next_incoming_id((FLOW_HANDLE)local_60,(transfer_number *)&local_48);
        if (iVar3 != 0) {
          local_48 = (AMQP_VALUE)CONCAT44(local_48._4_4_,*(undefined4 *)((long)context + 0x48));
        }
        iVar3 = flow_get_next_outgoing_id
                          ((FLOW_HANDLE)local_60,(transfer_number *)((long)context + 0x4c));
        if ((iVar3 == 0) &&
           (iVar3 = flow_get_incoming_window((FLOW_HANDLE)local_60,(uint32_t *)&local_40),
           iVar3 == 0)) {
          *(int *)((long)context + 0x60) =
               ((int)local_40 + (int)local_48) - *(int *)((long)context + 0x48);
          iVar3 = flow_get_handle((FLOW_HANDLE)local_60,(handle *)&local_50);
          uVar12 = 0;
          if (iVar3 == 0) {
            uVar6 = (ulong)*(uint *)((long)context + 0x30);
            if (uVar6 != 0) {
              uVar8 = 0;
              do {
                uVar12 = uVar8;
                if (*(handle *)(*(long *)(*(long *)((long)context + 0x28) + uVar8 * 8) + 8) ==
                    (handle)local_50) break;
                uVar8 = uVar8 + 1;
                uVar12 = uVar6;
              } while (uVar6 != uVar8);
            }
            if ((uint)uVar12 == *(uint *)((long)context + 0x30)) {
              uVar12 = 0;
            }
            else {
              uVar12 = *(ulong *)(*(long *)((long)context + 0x28) + (uVar12 & 0xffffffff) * 8);
            }
          }
          flow_destroy((FLOW_HANDLE)local_60);
          if ((uVar12 != 0) && (*(int *)(uVar12 + 0x38) != 2)) {
            (**(code **)(uVar12 + 0x10))
                      (*(undefined8 *)(uVar12 + 0x28),performative,payload_size,payload_bytes);
          }
          if (*(int *)((long)context + 0x60) == 0) {
            return;
          }
          uVar12 = 0;
          do {
            if (*(uint *)((long)context + 0x30) <= uVar12) {
              return;
            }
            lVar7 = *(long *)(*(long *)((long)context + 0x28) + uVar12 * 8);
            if ((*(int *)(lVar7 + 0x38) != 2) && (*(code **)(lVar7 + 0x20) != (code *)0x0)) {
              (**(code **)(lVar7 + 0x20))(*(undefined8 *)(lVar7 + 0x28));
            }
            uVar12 = uVar12 + 1;
          } while (*(int *)((long)context + 0x60) != 0);
          return;
        }
        flow_destroy((FLOW_HANDLE)local_60);
      }
      pcVar10 = "amqp:decode-error";
      pcVar9 = "Cannot decode FLOW frame";
      goto LAB_0011b0d8;
    }
    _Var1 = is_transfer_type_by_descriptor(descriptor);
    if (_Var1) {
      iVar3 = amqpvalue_get_transfer(performative,(TRANSFER_HANDLE *)&local_60);
      if (iVar3 == 0) {
        transfer_get_delivery_id((TRANSFER_HANDLE)local_60,(delivery_number *)&local_48);
        iVar3 = transfer_get_handle((TRANSFER_HANDLE)local_60,(handle *)&local_50);
        transfer_destroy((TRANSFER_HANDLE)local_60);
        if (iVar3 == 0) {
          *(int *)((long)context + 0x4c) = *(int *)((long)context + 0x4c) + 1;
          *(int *)((long)context + 100) = *(int *)((long)context + 100) + -1;
          *(int *)((long)context + 0x54) = *(int *)((long)context + 0x54) + -1;
          uVar12 = (ulong)*(uint *)((long)context + 0x30);
          if (uVar12 == 0) {
            uVar6 = 0;
          }
          else {
            uVar8 = 0;
            do {
              uVar6 = uVar8;
              if (*(handle *)(*(long *)(*(long *)((long)context + 0x28) + uVar8 * 8) + 8) ==
                  (handle)local_50) break;
              uVar8 = uVar8 + 1;
              uVar6 = uVar12;
            } while (uVar12 != uVar8);
          }
          if ((uint)uVar6 == *(uint *)((long)context + 0x30)) {
            lVar7 = 0;
          }
          else {
            lVar7 = *(long *)(*(long *)((long)context + 0x28) + (uVar6 & 0xffffffff) * 8);
          }
          if (lVar7 == 0) {
            end_session_with_error((SESSION_INSTANCE *)context,"amqp:session:unattached-handle","");
          }
          else if (*(int *)(lVar7 + 0x38) != 2) {
            (**(code **)(lVar7 + 0x10))
                      (*(undefined8 *)(lVar7 + 0x28),performative,payload_size,payload_bytes);
          }
          if (*(int *)((long)context + 0x54) != 0) {
            return;
          }
          *(undefined4 *)((long)context + 0x54) = *(undefined4 *)((long)context + 0x50);
          send_flow((SESSION_INSTANCE *)context);
          return;
        }
        pcVar10 = "amqp:decode-error";
        pcVar9 = "Cannot get handle from TRANSFER frame";
      }
      else {
        pcVar10 = "amqp:decode-error";
        pcVar9 = "Cannot decode TRANSFER frame";
      }
      goto LAB_0011b0d8;
    }
    _Var1 = is_disposition_type_by_descriptor(descriptor);
    if (_Var1) {
      if (*(int *)((long)context + 0x30) == 0) {
        return;
      }
      uVar12 = 0;
      do {
        lVar7 = *(long *)(*(long *)((long)context + 0x28) + uVar12 * 8);
        if (*(int *)(lVar7 + 0x38) != 2) {
          (**(code **)(lVar7 + 0x10))
                    (*(undefined8 *)(lVar7 + 0x28),performative,payload_size,payload_bytes);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < *(uint *)((long)context + 0x30));
      return;
    }
    _Var1 = is_end_type_by_descriptor(descriptor);
    if (!_Var1) {
      return;
    }
    iVar3 = amqpvalue_get_end(performative,(END_HANDLE *)&local_60);
    if (iVar3 != 0) {
      pcVar10 = "amqp:decode-error";
      pcVar9 = "Cannot decode END frame";
      goto LAB_0011b0d8;
    }
    end_destroy((END_HANDLE)local_60);
    if ((*(uint *)((long)context + 0x10) & 0xfffffffe) == 6) {
      return;
    }
    session_set_state((SESSION_INSTANCE *)context,SESSION_STATE_END_RCVD);
    iVar3 = send_end_frame((SESSION_INSTANCE *)context,(ERROR_HANDLE)0x0);
    if (iVar3 != 0) {
      pCVar11 = *(CONNECTION_HANDLE *)((long)context + 0x18);
      pcVar9 = "Cannot send END frame.";
      goto LAB_0011b076;
    }
LAB_0011b07d:
    session_state = SESSION_STATE_DISCARDING;
    goto LAB_0011b08f;
  }
  local_60 = (BEGIN_HANDLE)0x0;
  iVar3 = amqpvalue_get_attach(performative,(ATTACH_HANDLE *)&local_50);
  if (iVar3 != 0) {
    pcVar10 = "amqp:decode-error";
    pcVar9 = "Cannot decode ATTACH frame";
    goto LAB_0011b0d8;
  }
  iVar3 = attach_get_name((ATTACH_HANDLE)CONCAT44(local_50._4_4_,(handle)local_50),
                          (char **)&local_60);
  if (iVar3 == 0) {
    iVar3 = attach_get_role((ATTACH_HANDLE)CONCAT44(local_50._4_4_,(handle)local_50),&local_51);
    if (iVar3 == 0) {
      iVar3 = attach_get_source((ATTACH_HANDLE)CONCAT44(local_50._4_4_,(handle)local_50),&local_48);
      if (iVar3 != 0) {
        local_48 = (AMQP_VALUE)0x0;
      }
      iVar3 = attach_get_target((ATTACH_HANDLE)CONCAT44(local_50._4_4_,(handle)local_50),&local_40);
      if (iVar3 != 0) {
        local_40 = (AMQP_VALUE)0x0;
      }
      iVar3 = attach_get_properties
                        ((ATTACH_HANDLE)CONCAT44(local_50._4_4_,(handle)local_50),&local_38);
      name = local_60;
      if (iVar3 != 0) {
        local_38 = (fields)0x0;
      }
      pLVar4 = find_link_endpoint_by_name((SESSION_INSTANCE *)context,(char *)local_60);
      if (pLVar4 == (LINK_ENDPOINT_INSTANCE *)0x0) {
        if (*(long *)((long)context + 0x38) == 0) goto LAB_0011ae24;
        pLVar5 = session_create_link_endpoint((SESSION_HANDLE)context,(char *)name);
        if (pLVar5 == (LINK_ENDPOINT_HANDLE)0x0) {
          pcVar10 = "amqp:internal-error";
          pcVar9 = "Cannot create link endpoint";
          goto LAB_0011ae1c;
        }
        iVar3 = attach_get_handle((ATTACH_HANDLE)CONCAT44(local_50._4_4_,(handle)local_50),
                                  &pLVar5->input_handle);
        if (iVar3 == 0) {
          pLVar5->link_endpoint_state = LINK_ENDPOINT_STATE_ATTACHED;
          cVar2 = (**(code **)((long)context + 0x38))
                            (*(undefined8 *)((long)context + 0x40),pLVar5,local_60,local_51,local_48
                             ,local_40,local_38);
          if (cVar2 == '\0') {
            remove_link_endpoint(pLVar5);
            free_link_endpoint(pLVar5);
          }
          else if (pLVar5->frame_received_callback != (ON_ENDPOINT_FRAME_RECEIVED)0x0) {
            (*pLVar5->frame_received_callback)
                      (pLVar5->callback_context,performative,payload_size,payload_bytes);
          }
          goto LAB_0011ae24;
        }
      }
      else {
        if (pLVar4->link_endpoint_state == LINK_ENDPOINT_STATE_DETACHING) goto LAB_0011ae24;
        iVar3 = attach_get_handle((ATTACH_HANDLE)CONCAT44(local_50._4_4_,(handle)local_50),
                                  &pLVar4->input_handle);
        if (iVar3 == 0) {
          pLVar4->link_endpoint_state = LINK_ENDPOINT_STATE_ATTACHED;
          if ((*(code **)((long)context + 0x38) != (code *)0x0) &&
             (cVar2 = (**(code **)((long)context + 0x38))
                                (*(undefined8 *)((long)context + 0x40),pLVar4,local_60,local_51,
                                 local_48,local_40,local_38), cVar2 == '\0')) {
            pLVar4->link_endpoint_state = LINK_ENDPOINT_STATE_DETACHING;
          }
          (*pLVar4->frame_received_callback)
                    (pLVar4->callback_context,performative,payload_size,payload_bytes);
          goto LAB_0011ae24;
        }
      }
      pcVar10 = "amqp:decode-error";
      pcVar9 = "Cannot get input handle from ATTACH frame";
    }
    else {
      pcVar10 = "amqp:decode-error";
      pcVar9 = "Cannot get link role from ATTACH frame";
    }
  }
  else {
    pcVar10 = "amqp:decode-error";
    pcVar9 = "Cannot get link name from ATTACH frame";
  }
LAB_0011ae1c:
  end_session_with_error((SESSION_INSTANCE *)context,pcVar10,pcVar9);
LAB_0011ae24:
  attach_destroy((ATTACH_HANDLE)CONCAT44(local_50._4_4_,(handle)local_50));
  return;
}

Assistant:

static void on_frame_received(void* context, AMQP_VALUE performative, uint32_t payload_size, const unsigned char* payload_bytes)
{
    SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)context;
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(performative);

    if (is_begin_type_by_descriptor(descriptor))
    {
        BEGIN_HANDLE begin_handle;

        if (amqpvalue_get_begin(performative, &begin_handle) != 0)
        {
            connection_close(session_instance->connection, "amqp:decode-error", "Cannot decode BEGIN frame", NULL);
        }
        else
        {
            if ((begin_get_incoming_window(begin_handle, &session_instance->remote_incoming_window) != 0) ||
                (begin_get_next_outgoing_id(begin_handle, &session_instance->next_incoming_id) != 0))
            {
                /* error */
                begin_destroy(begin_handle);
                session_set_state(session_instance, SESSION_STATE_DISCARDING);
                connection_close(session_instance->connection, "amqp:decode-error", "Cannot get incoming windows and next outgoing id", NULL);
            }
            else
            {
                begin_destroy(begin_handle);

                if (session_instance->session_state == SESSION_STATE_BEGIN_SENT)
                {
                    session_set_state(session_instance, SESSION_STATE_MAPPED);
                }
                else if(session_instance->session_state == SESSION_STATE_UNMAPPED)
                {
                    session_set_state(session_instance, SESSION_STATE_BEGIN_RCVD);
                    if (send_begin(session_instance) != 0)
                    {
                        connection_close(session_instance->connection, "amqp:internal-error", "Failed sending BEGIN frame", NULL);
                        session_set_state(session_instance, SESSION_STATE_DISCARDING);
                    }
                    else
                    {
                        session_set_state(session_instance, SESSION_STATE_MAPPED);
                    }
                }
            }
        }
    }
    else if (is_attach_type_by_descriptor(descriptor))
    {
        const char* name = NULL;
        ATTACH_HANDLE attach_handle;

        if (amqpvalue_get_attach(performative, &attach_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode ATTACH frame");
        }
        else
        {
            role role;
            AMQP_VALUE source;
            AMQP_VALUE target;
            fields properties;

            if (attach_get_name(attach_handle, &name) != 0)
            {
                end_session_with_error(session_instance, "amqp:decode-error", "Cannot get link name from ATTACH frame");
            }
            else if (attach_get_role(attach_handle, &role) != 0)
            {
                end_session_with_error(session_instance, "amqp:decode-error", "Cannot get link role from ATTACH frame");
            }
            else
            {
                LINK_ENDPOINT_INSTANCE* link_endpoint;

                if (attach_get_source(attach_handle, &source) != 0)
                {
                    source = NULL;
                }
                if (attach_get_target(attach_handle, &target) != 0)
                {
                    target = NULL;
                }
                if (attach_get_properties(attach_handle, &properties) != 0)
                {
                    properties = NULL;
                }

                link_endpoint = find_link_endpoint_by_name(session_instance, name);
                if (link_endpoint == NULL)
                {
                    /* new link attach */
                    if (session_instance->on_link_attached != NULL)
                    {
                        LINK_ENDPOINT_HANDLE new_link_endpoint = session_create_link_endpoint(session_instance, name);
                        if (new_link_endpoint == NULL)
                        {
                            end_session_with_error(session_instance, "amqp:internal-error", "Cannot create link endpoint");
                        }
                        else if (attach_get_handle(attach_handle, &new_link_endpoint->input_handle) != 0)
                        {
                            end_session_with_error(session_instance, "amqp:decode-error", "Cannot get input handle from ATTACH frame");
                        }
                        else
                        {
                            new_link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_ATTACHED;

                            if (!session_instance->on_link_attached(session_instance->on_link_attached_callback_context, new_link_endpoint, name, role, source, target, properties))
                            {
                                remove_link_endpoint(new_link_endpoint);
                                free_link_endpoint(new_link_endpoint);
                                new_link_endpoint = NULL;
                            }
                            else
                            {
                                if (new_link_endpoint->frame_received_callback != NULL)
                                {
                                    new_link_endpoint->frame_received_callback(new_link_endpoint->callback_context, performative, payload_size, payload_bytes);
                                }
                            }
                        }
                    }
                }
                else if (link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
                {
                    if (attach_get_handle(attach_handle, &link_endpoint->input_handle) != 0)
                    {
                        end_session_with_error(session_instance, "amqp:decode-error", "Cannot get input handle from ATTACH frame");
                    }
                    else
                    {
                        link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_ATTACHED;

                        if (session_instance->on_link_attached != NULL)
                        {
                            if (!session_instance->on_link_attached(session_instance->on_link_attached_callback_context, link_endpoint, name, role, source, target, properties))
                            {
                                link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_DETACHING;
                            }
                        }

                        link_endpoint->frame_received_callback(link_endpoint->callback_context, performative, payload_size, payload_bytes);
                    }
                }
            }

            attach_destroy(attach_handle);
        }
    }
    else if (is_detach_type_by_descriptor(descriptor))
    {
        DETACH_HANDLE detach_handle;

        if (amqpvalue_get_detach(performative, &detach_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode DETACH frame");
        }
        else
        {
            uint32_t remote_handle;
            if (detach_get_handle(detach_handle, &remote_handle) != 0)
            {
                end_session_with_error(session_instance, "amqp:decode-error", "Cannot get handle from DETACH frame");

                detach_destroy(detach_handle);
            }
            else
            {
                LINK_ENDPOINT_INSTANCE* link_endpoint;
                detach_destroy(detach_handle);

                link_endpoint = find_link_endpoint_by_input_handle(session_instance, remote_handle);
                if (link_endpoint == NULL)
                {
                    end_session_with_error(session_instance, "amqp:session:unattached-handle", "");
                }
                else
                {
                    if (link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
                    {
                        link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_DETACHING;
                        link_endpoint->frame_received_callback(link_endpoint->callback_context, performative, payload_size, payload_bytes);
                    }
                    else
                    {
                        /* remove the link endpoint */
                        remove_link_endpoint(link_endpoint);
                        free_link_endpoint(link_endpoint);
                    }
                }
            }
        }
    }
    else if (is_flow_type_by_descriptor(descriptor))
    {
        FLOW_HANDLE flow_handle;

        if (amqpvalue_get_flow(performative, &flow_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode FLOW frame");
        }
        else
        {
            uint32_t remote_handle;
            transfer_number flow_next_incoming_id;
            uint32_t flow_incoming_window;

            if (flow_get_next_incoming_id(flow_handle, &flow_next_incoming_id) != 0)
            {
                /*
                If the next-incoming-id field of the flow frame is not set,
                then remote-incomingwindow is computed as follows:
                initial-outgoing-id(endpoint) + incoming-window(flow) - next-outgoing-id(endpoint)
                */
                flow_next_incoming_id = session_instance->next_outgoing_id;
            }

            if ((flow_get_next_outgoing_id(flow_handle, &session_instance->next_incoming_id) != 0) ||
                (flow_get_incoming_window(flow_handle, &flow_incoming_window) != 0))
            {
                flow_destroy(flow_handle);

                end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode FLOW frame");
            }
            else
            {
                LINK_ENDPOINT_INSTANCE* link_endpoint_instance = NULL;
                size_t i;

                session_instance->remote_incoming_window = flow_next_incoming_id + flow_incoming_window - session_instance->next_outgoing_id;

                if (flow_get_handle(flow_handle, &remote_handle) == 0)
                {
                    link_endpoint_instance = find_link_endpoint_by_input_handle(session_instance, remote_handle);
                }

                flow_destroy(flow_handle);

                if (link_endpoint_instance != NULL)
                {
                    if (link_endpoint_instance->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
                    {
                        link_endpoint_instance->frame_received_callback(link_endpoint_instance->callback_context, performative, payload_size, payload_bytes);
                    }
                }

                i = 0;
                while ((session_instance->remote_incoming_window > 0) && (i < session_instance->link_endpoint_count))
                {
                    /* notify the caller that it can send here */
                    if (session_instance->link_endpoints[i]->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING &&
                        session_instance->link_endpoints[i]->on_session_flow_on != NULL)
                    {
                        session_instance->link_endpoints[i]->on_session_flow_on(session_instance->link_endpoints[i]->callback_context);
                    }

                    i++;
                }
            }
        }
    }
    else if (is_transfer_type_by_descriptor(descriptor))
    {
        TRANSFER_HANDLE transfer_handle;

        if (amqpvalue_get_transfer(performative, &transfer_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode TRANSFER frame");
        }
        else
        {
            uint32_t remote_handle;
            delivery_number delivery_id;

            transfer_get_delivery_id(transfer_handle, &delivery_id);
            if (transfer_get_handle(transfer_handle, &remote_handle) != 0)
            {
                transfer_destroy(transfer_handle);
                end_session_with_error(session_instance, "amqp:decode-error", "Cannot get handle from TRANSFER frame");
            }
            else
            {
                LINK_ENDPOINT_INSTANCE* link_endpoint;
                transfer_destroy(transfer_handle);

                session_instance->next_incoming_id++;
                session_instance->remote_outgoing_window--;
                session_instance->incoming_window--;

                link_endpoint = find_link_endpoint_by_input_handle(session_instance, remote_handle);
                if (link_endpoint == NULL)
                {
                    end_session_with_error(session_instance, "amqp:session:unattached-handle", "");
                }
                else
                {
                    if (link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
                    {
                        link_endpoint->frame_received_callback(link_endpoint->callback_context, performative, payload_size, payload_bytes);
                    }
                }

                if (session_instance->incoming_window == 0)
                {
                    session_instance->incoming_window = session_instance->desired_incoming_window;
                    send_flow(session_instance);
                }
            }
        }
    }
    else if (is_disposition_type_by_descriptor(descriptor))
    {
        uint32_t i;

        for (i = 0; i < session_instance->link_endpoint_count; i++)
        {
            LINK_ENDPOINT_INSTANCE* link_endpoint = session_instance->link_endpoints[i];
            if (link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
            {
                link_endpoint->frame_received_callback(link_endpoint->callback_context, performative, payload_size, payload_bytes);
            }
        }
    }
    else if (is_end_type_by_descriptor(descriptor))
    {
        END_HANDLE end_handle;

        if (amqpvalue_get_end(performative, &end_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode END frame");
        }
        else
        {
            end_destroy(end_handle);
            if ((session_instance->session_state != SESSION_STATE_END_RCVD) &&
                (session_instance->session_state != SESSION_STATE_DISCARDING))
            {
                session_set_state(session_instance, SESSION_STATE_END_RCVD);
                if (send_end_frame(session_instance, NULL) != 0)
                {
                    /* fatal error */
                    (void)connection_close(session_instance->connection, "amqp:internal-error", "Cannot send END frame.", NULL);
                }

                session_set_state(session_instance, SESSION_STATE_DISCARDING);
            }
        }
    }
}